

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::alloc_chunk(ImChunkStream<ImGuiWindowSettings> *this,size_t sz)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (this->Buf).Size;
  uVar2 = (int)sz + 7U & 0xfffffffc;
  ImVector<char>::resize(&this->Buf,iVar1 + uVar2);
  *(uint *)((this->Buf).Data + iVar1) = uVar2;
  return (ImGuiWindowSettings *)((this->Buf).Data + (long)iVar1 + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }